

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool MomentChi2Test(HashInfo *info,int inputSize)

{
  uint uVar1;
  double dVar2;
  pfHash p_Var3;
  char *pcVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  undefined8 uStack_2c0;
  longdouble lStack_2b8;
  undefined8 uStack_2a0;
  uint auStack_298 [3];
  undefined1 local_28a;
  undefined1 local_289;
  undefined *local_288;
  longdouble local_280;
  int local_274;
  uint *local_270;
  byte local_261;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  ulong local_200;
  char *local_1f8;
  char *rankstr [4];
  int rank;
  double chi2_3;
  double chi2_2;
  double chi2_1;
  double chi2;
  double worsec2;
  uint64_t b0_exp5_1;
  uint64_t b1_exp5_1;
  uint64_t bits0_1;
  uint64_t bits1_1;
  uint64_t b0_exp5;
  uint64_t b1_exp5;
  uint64_t bits0;
  uint64_t bits1;
  uint64_t h;
  undefined1 auStack_158 [4];
  uint i;
  longdouble db0l;
  longdouble db0h;
  longdouble b0l;
  longdouble b0h;
  longdouble db1l;
  longdouble db1h;
  longdouble b1l;
  longdouble b1h;
  ulong local_d0;
  uint64_t previous;
  longdouble srefl;
  longdouble srefh;
  char hbuff [64];
  int local_5c;
  int hbits;
  unsigned_long __vla_expr0;
  longdouble n;
  uint mx;
  uint s;
  int step;
  pfHash hash;
  int inputSize_local;
  HashInfo *info_local;
  
  p_Var3 = info->hash;
  if ((500.0 < g_speed) || (local_261 = 0, 0x80 < info->hashbits)) {
    local_261 = g_testExtra ^ 0xff;
  }
  uVar1 = (local_261 & 1) * 3 + 3;
  local_200 = 0xfffffff0 / (ulong)uVar1;
  lVar9 = (longdouble)local_200;
  lVar5 = -((ulong)(uint)inputSize + 0xf & 0xfffffffffffffff0);
  local_270 = (uint *)((long)auStack_298 + lVar5);
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107ac7;
  memset((uint *)((long)auStack_298 + lVar5),0,(ulong)(uint)inputSize);
  local_5c = info->hashbits;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107ae4;
  memset((void *)((long)&srefh + 8),0,0x40);
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107afb;
  printf("Analyze hashes produced from a serie of linearly increasing numbers of %i-bit, using a step of %d ... \n"
         ,(ulong)(uint)(inputSize << 3),(ulong)uVar1);
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107b04;
  fflush((FILE *)0x0);
  if (0x40 < local_5c) {
    local_5c = 0x40;
  }
  local_274 = local_5c;
  if (local_5c < 0) {
    local_274 = local_5c + 7;
  }
  local_274 = local_274 >> 3;
  if (local_274 == 4) {
    register0x00001100 = (longdouble)1.39129e+06;
    _previous = (longdouble)1030.9;
  }
  else {
    if (local_274 != 8) {
      *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107b7d;
      printf("hash size not covered \n");
      *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107b82;
      abort();
    }
    register0x00001100 = (longdouble)3.89182e+07;
    _previous = (longdouble)410450.0;
  }
  *(longdouble *)(&stack0xfffffffffffffd58 + lVar5) = _previous;
  *(longdouble *)((long)&lStack_2b8 + lVar5) = stack0xffffffffffffff48;
  *(undefined8 *)((long)&uStack_2c0 + lVar5) = 0x107ba8;
  printf("Target values to approximate : %Lf - %Lf \n");
  local_d0 = 0;
  local_280 = (longdouble)0;
  _auStack_158 = local_280;
  unique0x1000098b = local_280;
  unique0x10000995 = local_280;
  unique0x1000099f = local_280;
  unique0x100009a9 = local_280;
  unique0x100009b3 = local_280;
  unique0x100009bd = local_280;
  unique0x100009c7 = local_280;
  for (h._4_4_ = 1; puVar6 = local_270, h._4_4_ < 0xfffffff1; h._4_4_ = uVar1 + h._4_4_) {
    *local_270 = h._4_4_;
    *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x107c38;
    (*p_Var3)(puVar6,inputSize,0,(void *)((long)&srefh + 8));
    lVar7 = POPCOUNT(stack0xffffffffffffff58);
    lVar8 = local_5c - lVar7;
    local_260 = lVar7 * lVar7 * lVar7 * lVar7 * lVar7;
    local_250 = lVar8 * lVar8 * lVar8 * lVar8 * lVar8;
    local_288 = &DAT_002bc028;
    register0x00001110 = stack0xffffffffffffff18 + (longdouble)0.0 + (longdouble)local_260;
    local_258 = local_260 * local_260;
    register0x00001110 =
         stack0xffffffffffffff08 +
         (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_258 < 0) * 4) + (longdouble)local_258;
    register0x00001110 =
         stack0xfffffffffffffed8 +
         (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_250 < 0) * 4) + (longdouble)local_250;
    local_248 = local_250 * local_250;
    register0x00001110 =
         stack0xfffffffffffffec8 +
         (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_248 < 0) * 4) + (longdouble)local_248;
    lVar7 = POPCOUNT(local_d0 ^ stack0xffffffffffffff58);
    lVar8 = local_5c - lVar7;
    local_240 = lVar7 * lVar7 * lVar7 * lVar7 * lVar7;
    local_230 = lVar8 * lVar8 * lVar8 * lVar8 * lVar8;
    register0x00001110 = stack0xfffffffffffffef8 + (longdouble)0.0 + (longdouble)local_240;
    local_238 = local_240 * local_240;
    register0x00001110 =
         stack0xfffffffffffffee8 +
         (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_238 < 0) * 4) + (longdouble)local_238;
    register0x00001110 =
         stack0xfffffffffffffeb8 +
         (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_230 < 0) * 4) + (longdouble)local_230;
    local_228 = local_230 * local_230;
    _auStack_158 = _auStack_158 +
                   (longdouble)*(float *)(&DAT_002bc028 + (ulong)(local_228 < 0) * 4) +
                   (longdouble)local_228;
    local_d0 = stack0xffffffffffffff58;
  }
  register0x00001110 = stack0xffffffffffffff18 / lVar9;
  lVar10 = (stack0xffffffffffffff08 / lVar9 - register0x00001110 * register0x00001110) / lVar9;
  register0x00001110 = stack0xfffffffffffffef8 / lVar9;
  lVar11 = (stack0xfffffffffffffee8 / lVar9 - register0x00001110 * register0x00001110) / lVar9;
  register0x00001110 = stack0xfffffffffffffed8 / lVar9;
  lVar12 = (stack0xfffffffffffffec8 / lVar9 - register0x00001110 * register0x00001110) / lVar9;
  register0x00001110 = stack0xfffffffffffffeb8 / lVar9;
  lVar9 = (_auStack_158 / lVar9 - register0x00001110 * register0x00001110) / lVar9;
  *(longdouble *)(&stack0xfffffffffffffd58 + lVar5) = lVar10;
  *(longdouble *)((long)&lStack_2b8 + lVar5) = register0x00001110;
  local_289 = 0;
  *(undefined8 *)((long)&uStack_2c0 + lVar5) = 0x107fc3;
  printf("Popcount 1 stats : %Lf - %Lf\n");
  *(longdouble *)(&stack0xfffffffffffffd58 + lVar5) = lVar12;
  *(longdouble *)((long)&lStack_2b8 + lVar5) = register0x00001110;
  *(undefined8 *)((long)&uStack_2c0 + lVar5) = 0x107ff1;
  printf("Popcount 0 stats : %Lf - %Lf\n");
  chi2 = 0.0;
  dVar2 = (double)(((register0x00001110 - stack0xffffffffffffff48) *
                   (register0x00001110 - stack0xffffffffffffff48)) / (_previous + lVar10));
  local_208 = dVar2;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x10804c;
  printf("MomentChi2 for bits 1 :  %8.6g \n",dVar2);
  if (0.0 < dVar2) {
    chi2 = dVar2;
  }
  dVar2 = (double)(((register0x00001110 - stack0xffffffffffffff48) *
                   (register0x00001110 - stack0xffffffffffffff48)) / (_previous + lVar12));
  local_210 = dVar2;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x1080ba;
  printf("MomentChi2 for bits 0 :  %8.6g \n",dVar2);
  if (chi2 < dVar2) {
    chi2 = dVar2;
  }
  local_28a = 0;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x1080f0;
  printf("\nDerivative stats (transition from 2 consecutive values) : \n");
  *(longdouble *)(&stack0xfffffffffffffd58 + lVar5) = lVar11;
  *(longdouble *)((long)&lStack_2b8 + lVar5) = register0x00001110;
  *(undefined8 *)((long)&uStack_2c0 + lVar5) = 0x10811a;
  printf("Popcount 1 stats : %Lf - %Lf\n");
  *(longdouble *)(&stack0xfffffffffffffd58 + lVar5) = lVar9;
  *(longdouble *)((long)&lStack_2b8 + lVar5) = register0x00001110;
  *(undefined8 *)((long)&uStack_2c0 + lVar5) = 0x108148;
  printf("Popcount 0 stats : %Lf - %Lf\n");
  dVar2 = (double)(((register0x00001110 - stack0xffffffffffffff48) *
                   (register0x00001110 - stack0xffffffffffffff48)) / (_previous + lVar11));
  local_218 = dVar2;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x108198;
  printf("MomentChi2 for deriv b1 :  %8.6g \n",dVar2);
  if (chi2 < dVar2) {
    chi2 = dVar2;
  }
  dVar2 = (double)(((register0x00001110 - stack0xffffffffffffff48) *
                   (register0x00001110 - stack0xffffffffffffff48)) / (_previous + lVar9));
  local_220 = dVar2;
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x108206;
  printf("MomentChi2 for deriv b0 :  %8.6g \n",dVar2);
  if (chi2 < dVar2) {
    chi2 = dVar2;
  }
  rankstr[3]._4_4_ = (uint)(chi2 < 500.0) + (uint)(chi2 < 50.0) + (uint)(chi2 < 5.0);
  local_1f8 = "FAIL !!!!";
  rankstr[0] = "pass";
  rankstr[1] = "Good !";
  rankstr[2] = "Great !!";
  pcVar4 = rankstr[(long)rankstr[3]._4_4_ + -1];
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x1082d1;
  printf("\n  %s \n\n",pcVar4);
  *(undefined8 *)((long)&uStack_2a0 + lVar5) = 0x1082da;
  fflush((FILE *)0x0);
  return 0 < rankstr[3]._4_4_;
}

Assistant:

bool MomentChi2Test ( struct HashInfo *info, int inputSize)
{
  pfHash const hash = info->hash;
  const int step = ((g_speed > 500 || info->hashbits > 128)
                    && !g_testExtra) ? 6 : 3;
  unsigned s = 0;
  const unsigned mx = 0xfffffff0;
  assert(inputSize >= 4);
  long double n = mx/step;
  char key[inputSize]; memset(key, 0, sizeof(key));
#define HASH_SIZE_MAX 64
  int hbits = info->hashbits;
  assert(hbits <= HASH_SIZE_MAX*8);
  char hbuff[HASH_SIZE_MAX] = {0};

  assert(inputSize > 0);
  printf("Analyze hashes produced from a serie of linearly increasing numbers "
         "of %i-bit, using a step of %d ... \n", inputSize*8, step);
  fflush(NULL);

  /* Notes on the ranking system.
   * Ideally, this test should report and sum all popcount values
   * and compare the resulting distribution to an ideal distribution.
   *
   * What happens here is quite simplified :
   * the test gives "points" for each popcount, and sum them all.
   * The metric (using N^5) is heavily influenced by the largest outliers.
   * For example, a 64-bit hash should have a popcount close to 32.
   * But a popcount==40 will tilt the metric upward
   * more than popcount==24 will tilt the metric downward.
   * In reality, both situations should be ranked similarly.
   *
   * To compensate, we measure both popcount1 and popcount0,
   * and compare to some pre-calculated "optimal" sums for the hash size.
   *
   * Another limitation of this test is that it only popcounts the first 64-bit.
   * For large hashes, bits beyond this limit are ignored.
   */

  if (hbits > 64) hbits = 64;   // limited due to popcount8
  long double srefh, srefl;
  switch (hbits/8) {
      case 8:
          srefh = 38918200.;
          srefl = 410450.;
          break;
      case 4:
          srefh = 1391290.;
          srefl = 1030.9;
          break;
      default:
          printf("hash size not covered \n");
          abort();
  }
  printf("Target values to approximate : %Lf - %Lf \n", srefh, srefl);

  uint64_t previous = 0;
  long double b1h = 0. , b1l = 0., db1h = 0., db1l = 0.;
  long double b0h = 0. , b0l = 0., db0h = 0., db0l = 0.;
  for (unsigned i=1; i<=mx; i+=step) {
    assert(sizeof(i) <= inputSize);
    memcpy(key, &i, sizeof(i));
    hash(key, inputSize, s, hbuff);

    uint64_t h; memcpy(&h, hbuff, 8);
    // popcount8 assumed to work on 64-bit
    // note : ideally, one should rather popcount the whole hash
    {   uint64_t const bits1 = popcount8(h);
        uint64_t const bits0 = hbits - bits1;
        uint64_t const b1_exp5 = bits1 * bits1 * bits1 * bits1 * bits1;
        uint64_t const b0_exp5 = bits0 * bits0 * bits0 * bits0 * bits0;
        b1h+=b1_exp5; b1l+=b1_exp5*b1_exp5;
        b0h+=b0_exp5; b0l+=b0_exp5*b0_exp5;
    }
    // derivative
    {   uint64_t const bits1 = popcount8(previous^h);
        uint64_t const bits0 = hbits - bits1;
        uint64_t const b1_exp5 = bits1 * bits1 * bits1 * bits1 * bits1;
        uint64_t const b0_exp5 = bits0 * bits0 * bits0 * bits0 * bits0;
        db1h+=b1_exp5; db1l+=b1_exp5*b1_exp5;
        db0h+=b0_exp5; db0l+=b0_exp5*b0_exp5;
    }
    previous=h;
  }

  b1h/=n; b1l=(b1l/n-b1h*b1h)/n;
  db1h/=n; db1l=(db1l/n-db1h*db1h)/n;
  b0h/=n; b0l=(b0l/n-b0h*b0h)/n;
  db0h/=n; db0l=(db0l/n-db0h*db0h)/n;

  printf("Popcount 1 stats : %Lf - %Lf\n", b1h, b1l);
  printf("Popcount 0 stats : %Lf - %Lf\n", b0h, b0l);
  double worsec2 = 0;
  {   double chi2 = (b1h-srefh) * (b1h-srefh) / (b1l+srefl);
      printf("MomentChi2 for bits 1 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }
  {   double chi2 = (b0h-srefh) * (b0h-srefh) / (b0l+srefl);
      printf("MomentChi2 for bits 0 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }

  /* Derivative :
   * In this scenario, 2 consecutive hashes are xored,
   * and the outcome of this xor operation is then popcount controlled.
   * Obviously, the _order_ in which the hash values are generated becomes critical.
   *
   * This scenario comes from the prng world,
   * where derivative of the generated suite of random numbers is analyzed
   * to ensure the suite is truly "random".
   *
   * However, in almost all prng, the seed of next random number is the previous random number.
   *
   * This scenario is quite different: it introduces a fixed distance between 2 consecutive "seeds".
   * This is especially detrimental to algorithms relying on linear operations, such as multiplications.
   *
   * This scenario is relevant if the hash is used as a prng and generates values from a linearly increasing counter as a seed.
   * It is not relevant for scenarios employing the hash as a prng
   * with the more classical method of using the previous random number as a seed for the next one.
   * This scenario has no relevance for classical usages of hash algorithms,
   * such as hash tables, bloom filters and such, were only the raw values are ever used.
   */
  printf("\nDerivative stats (transition from 2 consecutive values) : \n");
  printf("Popcount 1 stats : %Lf - %Lf\n", db1h, db1l);
  printf("Popcount 0 stats : %Lf - %Lf\n", db0h, db0l);
  {   double chi2 = (db1h-srefh) * (db1h-srefh) / (db1l+srefl);
      printf("MomentChi2 for deriv b1 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }
  {   double chi2 = (db0h-srefh) * (db0h-srefh) / (db0l+srefl);
      printf("MomentChi2 for deriv b0 :  %8.6g \n", chi2);
      if (chi2 > worsec2) worsec2 = chi2;
  }

  // note : previous threshold : 3.84145882069413
  int const rank = (worsec2 < 500.) + (worsec2 < 50.) + (worsec2 < 5.);
  assert(0 <= rank && rank <= 3);

  const char* rankstr[4] = { "FAIL !!!!", "pass", "Good !", "Great !!" };
  printf("\n  %s \n\n", rankstr[rank]);
  fflush(NULL);

  return (rank > 0);
}